

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

int Jf_TtComputeForCut(Jf_Man_t *p,int iFuncLit0,int iFuncLit1,int *pCut0,int *pCut1,int *pCutOut)

{
  int *pCut;
  word *pwVar1;
  word *pwVar2;
  ulong *puVar3;
  uint uVar4;
  Vec_Mem_t *pVVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  word *pwVar10;
  word *pwVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint local_c8;
  word uTruth [4];
  word uTruth1 [4];
  word uTruth0 [4];
  
  pVVar5 = p->vTtMem;
  iVar9 = p->pPars->nLutSize;
  uVar15 = 1 << ((char)iVar9 - 6U & 0x1f);
  uVar17 = (ulong)uVar15;
  if (iVar9 < 7) {
    uVar17 = 1;
  }
  iVar7 = Abc_Lit2Var(iFuncLit0);
  pwVar10 = Vec_MemReadEntry(pVVar5,iVar7);
  pVVar5 = p->vTtMem;
  iVar7 = Abc_Lit2Var(iFuncLit1);
  pwVar11 = Vec_MemReadEntry(pVVar5,iVar7);
  iVar7 = Abc_LitIsCompl(iFuncLit0);
  iVar12 = (int)uVar17;
  Abc_TtCopy(uTruth0,pwVar10,iVar12,iVar7);
  iVar7 = Abc_LitIsCompl(iFuncLit1);
  Abc_TtCopy(uTruth1,pwVar11,iVar12,iVar7);
  pCut = pCutOut + 1;
  Abc_TtExpand(uTruth0,iVar9,pCut0 + 1,*pCut0 & 0xf,pCut,*pCutOut & 0xf);
  Abc_TtExpand(uTruth1,iVar9,pCut1 + 1,*pCut1 & 0xf,pCut,*pCutOut & 0xf);
  uVar18 = 0;
  if (0 < iVar12) {
    uVar18 = uVar17;
  }
  local_c8 = (uint)uTruth1[0] & (uint)uTruth0[0] & 1;
  if (((uint)uTruth1[0] & (uint)uTruth0[0] & 1) == 0) {
    for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
      uTruth[uVar17] = uTruth1[uVar17] & uTruth0[uVar17];
    }
  }
  else {
    for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
      uTruth[uVar17] = ~(uTruth1[uVar17] & uTruth0[uVar17]);
    }
  }
  uVar4 = *pCutOut;
  if (iVar9 < (int)uVar4) {
    __assert_fail("nVars <= nVarsAll",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  uVar18 = 0;
  uVar17 = (ulong)uVar15;
  if ((int)uVar15 < 1) {
    uVar17 = uVar18;
  }
  uVar14 = 0;
  if (0 < (int)uVar4) {
    uVar14 = (ulong)uVar4;
  }
  iVar7 = 0;
  do {
    if (uVar18 == uVar14) {
      if ((int)uVar4 < iVar7) {
        __assert_fail("k < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
      }
      *pCutOut = iVar7;
      if (((byte)uTruth[0] & 1) != 0) {
        __assert_fail("(uTruth[0] & 1) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                      ,0x43d,"int Jf_TtComputeForCut(Jf_Man_t *, int, int, int *, int *, int *)");
      }
      iVar9 = Vec_MemHashInsert(p->vTtMem,uTruth);
      iVar9 = Abc_Var2Lit(iVar9,local_c8);
      return iVar9;
    }
    bVar6 = (byte)uVar18;
    if (iVar9 < 7) {
      if ((s_Truths6Neg[uVar18] &
          (CONCAT71(uTruth[0]._1_7_,(byte)uTruth[0]) >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f) ^
          CONCAT71(uTruth[0]._1_7_,(byte)uTruth[0]))) != 0) {
LAB_005e4c24:
        if ((long)iVar7 < (long)uVar18) {
          pCut[iVar7] = pCut[uVar18];
          Abc_TtSwapVars(uTruth,iVar9,iVar7,(int)uVar18);
        }
        iVar7 = iVar7 + 1;
      }
    }
    else {
      if (uVar18 < 6) {
        uVar13 = 0;
        do {
          if (uVar17 == uVar13) goto LAB_005e4c4f;
          puVar3 = uTruth + uVar13;
          uVar13 = uVar13 + 1;
        } while ((s_Truths6Neg[uVar18] & (*puVar3 >> ((byte)(1 << (bVar6 & 0x1f)) & 0x3f) ^ *puVar3)
                 ) == 0);
        goto LAB_005e4c24;
      }
      uVar8 = 1 << (bVar6 - 6 & 0x1f);
      iVar12 = 2 << (bVar6 - 6 & 0x1f);
      uVar13 = 0;
      if (0 < (int)uVar8) {
        uVar13 = (ulong)uVar8;
      }
      pwVar11 = uTruth + (int)uVar8;
      for (pwVar10 = uTruth; pwVar10 < uTruth + (int)uVar15; pwVar10 = pwVar10 + iVar12) {
        uVar16 = 0;
        while (uVar13 != uVar16) {
          pwVar1 = pwVar10 + uVar16;
          pwVar2 = pwVar11 + uVar16;
          uVar16 = uVar16 + 1;
          if (*pwVar1 != *pwVar2) goto LAB_005e4c24;
        }
        pwVar11 = pwVar11 + iVar12;
      }
    }
LAB_005e4c4f:
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

int Jf_TtComputeForCut( Jf_Man_t * p, int iFuncLit0, int iFuncLit1, int * pCut0, int * pCut1, int * pCutOut )
{
    word uTruth[JF_WORD_MAX], uTruth0[JF_WORD_MAX], uTruth1[JF_WORD_MAX];
    int fCompl, truthId;
    int LutSize    = p->pPars->nLutSize;
    int nWords     = Abc_Truth6WordNum(p->pPars->nLutSize);
    word * pTruth0 = Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(iFuncLit0));
    word * pTruth1 = Vec_MemReadEntry(p->vTtMem, Abc_Lit2Var(iFuncLit1));
    Abc_TtCopy( uTruth0, pTruth0, nWords, Abc_LitIsCompl(iFuncLit0) );
    Abc_TtCopy( uTruth1, pTruth1, nWords, Abc_LitIsCompl(iFuncLit1) );
    Abc_TtExpand( uTruth0, LutSize, pCut0 + 1, Jf_CutSize(pCut0), pCutOut + 1, Jf_CutSize(pCutOut) );
    Abc_TtExpand( uTruth1, LutSize, pCut1 + 1, Jf_CutSize(pCut1), pCutOut + 1, Jf_CutSize(pCutOut) );
    fCompl         = (int)(uTruth0[0] & uTruth1[0] & 1);
    Abc_TtAnd( uTruth, uTruth0, uTruth1, nWords, fCompl );
    pCutOut[0]     = Abc_TtMinBase( uTruth, pCutOut + 1, pCutOut[0], LutSize );
    assert( (uTruth[0] & 1) == 0 );
    truthId        = Vec_MemHashInsert(p->vTtMem, uTruth);
    return Abc_Var2Lit( truthId, fCompl );
}